

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__seek_to_byte(ma_dr_flac_bs *bs,ma_uint64 offsetFromStart)

{
  ma_bool32 mVar1;
  ma_dr_flac_seek_proc p_Var2;
  ma_dr_flac_seek_origin mVar3;
  ma_bool32 mVar4;
  int iVar5;
  void *pvVar6;
  ulong uVar7;
  
  p_Var2 = bs->onSeek;
  pvVar6 = bs->pUserData;
  if (offsetFromStart >> 0x1f == 0) {
    iVar5 = (int)offsetFromStart;
    mVar3 = ma_dr_flac_seek_origin_start;
LAB_0016ff0b:
    mVar1 = (*p_Var2)(pvVar6,iVar5,mVar3);
    mVar4 = 0;
    if (mVar1 != 0) {
      bs->nextL2Line = 0x200;
      bs->consumedBits = 0x40;
      bs->cache = 0;
      bs->crc16Cache = 0;
      bs->crc16CacheIgnoredBytes = 0;
      bs->unalignedByteCount = 0;
      bs->unalignedCache = 0;
      mVar4 = 1;
    }
  }
  else {
    mVar1 = (*p_Var2)(pvVar6,0x7fffffff,ma_dr_flac_seek_origin_start);
    mVar4 = 0;
    if (mVar1 != 0) {
      uVar7 = offsetFromStart - 0x7fffffff;
      do {
        p_Var2 = bs->onSeek;
        pvVar6 = bs->pUserData;
        if ((uVar7 & 0xffffffff80000000) == 0) {
          iVar5 = (int)uVar7;
          mVar3 = ma_dr_flac_seek_origin_current;
          goto LAB_0016ff0b;
        }
        mVar1 = (*p_Var2)(pvVar6,0x7fffffff,ma_dr_flac_seek_origin_current);
        uVar7 = uVar7 - 0x7fffffff;
        mVar4 = 0;
      } while (mVar1 != 0);
    }
  }
  return mVar4;
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_byte(ma_dr_flac_bs* bs, ma_uint64 offsetFromStart)
{
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(offsetFromStart > 0);
    if (offsetFromStart > 0x7FFFFFFF) {
        ma_uint64 bytesRemaining = offsetFromStart;
        if (!bs->onSeek(bs->pUserData, 0x7FFFFFFF, ma_dr_flac_seek_origin_start)) {
            return MA_FALSE;
        }
        bytesRemaining -= 0x7FFFFFFF;
        while (bytesRemaining > 0x7FFFFFFF) {
            if (!bs->onSeek(bs->pUserData, 0x7FFFFFFF, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
            bytesRemaining -= 0x7FFFFFFF;
        }
        if (bytesRemaining > 0) {
            if (!bs->onSeek(bs->pUserData, (int)bytesRemaining, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
        }
    } else {
        if (!bs->onSeek(bs->pUserData, (int)offsetFromStart, ma_dr_flac_seek_origin_start)) {
            return MA_FALSE;
        }
    }
    ma_dr_flac__reset_cache(bs);
    return MA_TRUE;
}